

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O3

FixedArgSig * __thiscall
winmd::reader::NamedArgSig::parse_value
          (FixedArgSig *__return_storage_ptr__,NamedArgSig *this,database *db,byte_view *data)

{
  ElementType EVar1;
  ElementType type;
  uint8_t *puVar2;
  ElementType *pEVar3;
  table_base *this_00;
  value_type *pvVar4;
  undefined1 extraout_DL;
  byte_view *data_00;
  string_view sVar5;
  TypeDef TVar6;
  string_view type_string;
  string local_88;
  TypeDef local_68;
  EnumDefinition local_58;
  string_view local_40;
  
  byte_view::check_available(data,1);
  puVar2 = data->m_first;
  byte_view::check_available(data,1);
  data->m_first = data->m_first + 1;
  if ((byte)(*puVar2 + 0xab) < 0xfe) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"NamedArg must be either FIELD or PROPERTY","");
    impl::throw_invalid(&local_88);
  }
  byte_view::check_available(data,1);
  pEVar3 = data->m_first;
  byte_view::check_available(data,1);
  data->m_first = data->m_first + 1;
  EVar1 = *pEVar3;
  if (EVar1 == Enum) {
    local_40 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    sVar5 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    this->name = sVar5;
    TVar6 = cache::find(db->m_cache,&local_40);
    this_00 = TVar6.super_row_base<winmd::reader::TypeDef>.m_table;
    local_68.super_row_base<winmd::reader::TypeDef>.m_index =
         TVar6.super_row_base<winmd::reader::TypeDef>.m_index;
    local_68.super_row_base<winmd::reader::TypeDef>.m_table = this_00;
    if (this_00 == (table_base *)0x0) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"CustomAttribute named param referenced unresolved enum type",
                 "");
      impl::throw_invalid(&local_88);
    }
    local_58.m_typedef.super_row_base<winmd::reader::TypeDef>.m_index =
         table_base::get_value<unsigned_int>
                   (this_00,local_68.super_row_base<winmd::reader::TypeDef>.m_index,3);
    local_58.m_typedef.super_row_base<winmd::reader::TypeDef>.m_table = this_00;
    get_type_namespace_and_name
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)&local_88,(coded_index<winmd::reader::TypeDefOrRef> *)&local_58);
    if ((((local_88._M_dataplus._M_p != (pointer)0x6) ||
         ((short)*(int *)(local_88._M_string_length + 4) != 0x6d65 ||
          *(int *)local_88._M_string_length != 0x74737953)) ||
        (CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]) !=
         4)) || (*(int *)local_88.field_2._8_8_ != 0x6d756e45)) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"CustomAttribute named param referenced non-enum type","");
      impl::throw_invalid(&local_88);
    }
    EnumDefinition::EnumDefinition(&local_58,&local_68);
    local_88.field_2._M_local_buf[0] = local_58.m_underlying_type;
    local_88._M_string_length =
         CONCAT44(local_58.m_typedef.super_row_base<winmd::reader::TypeDef>._12_4_,
                  local_58.m_typedef.super_row_base<winmd::reader::TypeDef>.m_index);
    local_88._M_dataplus._M_p =
         (pointer)local_58.m_typedef.super_row_base<winmd::reader::TypeDef>.m_table;
    pvVar4 = ElemSig::read_enum((value_type *)(ulong)local_58.m_underlying_type,(ElementType)data,
                                data_00);
    *(pointer *)
     &(__return_storage_ptr__->value).
      super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
      .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_> =
         local_88._M_dataplus._M_p;
    *(size_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
     + 8) = local_88._M_string_length;
    *(ulong *)((long)&(__return_storage_ptr__->value).
                      super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
                      .
                      super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
                      .
                      super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
                      .
                      super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
                      .
                      super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
                      .
                      super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
              + 0x10) =
         CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,local_88.field_2._M_local_buf[0]);
    *(value_type **)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
     + 0x18) = pvVar4;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
     + 0x20) = extraout_DL;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
     + 0x28) = 0xe;
  }
  else {
    if (EVar1 != Type) {
      type = EVar1;
      if (EVar1 == SZArray) {
        byte_view::check_available(data,1);
        pEVar3 = data->m_first;
        byte_view::check_available(data,1);
        data->m_first = data->m_first + 1;
        type = *pEVar3;
      }
      if (0xf2 < (byte)(type - Ptr)) {
        sVar5 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
        this->name = sVar5;
        FixedArgSig::read_arg(&__return_storage_ptr__->value,type,EVar1 == SZArray,data);
        return __return_storage_ptr__;
      }
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,
                 "CustomAttribute named param must be a primitive, System.Type, or an Enum","");
      impl::throw_invalid(&local_88);
    }
    sVar5 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    this->name = sVar5;
    sVar5 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    *(string_view *)
     &(__return_storage_ptr__->value).
      super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
      .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_> =
         sVar5;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
     + 0x28) = 0xd;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
           .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
           super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
           super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
           super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
           super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
   + 0x30) = '\0';
  return __return_storage_ptr__;
}

Assistant:

FixedArgSig parse_value(database const& db, byte_view& data)
        {
            auto const field_or_prop = read<ElementType>(data);
            if (field_or_prop != ElementType::Field && field_or_prop != ElementType::Property)
            {
                impl::throw_invalid("NamedArg must be either FIELD or PROPERTY");
            }

            auto type = read<ElementType>(data);
            switch (type)
            {
            case ElementType::Type:
                name = read<std::string_view>(data);
                return FixedArgSig{ ElemSig::SystemType{read<std::string_view>(data)} };

            case ElementType::Enum:
            {
                auto type_string = read<std::string_view>(data);
                name = read<std::string_view>(data);
                auto type_def = db.get_cache().find(type_string);
                if (!type_def)
                {
                    impl::throw_invalid("CustomAttribute named param referenced unresolved enum type");
                }
                if (!type_def.is_enum())
                {
                    impl::throw_invalid("CustomAttribute named param referenced non-enum type");
                }

                return FixedArgSig{ type_def.get_enum_definition(), data };
            }

            default:
            {
                bool const is_array = (type == ElementType::SZArray);
                if (is_array)
                {
                    type = read<ElementType>(data);
                }
                if (type < ElementType::Boolean || ElementType::String < type)
                {
                    impl::throw_invalid("CustomAttribute named param must be a primitive, System.Type, or an Enum");
                }
                name = read<std::string_view>(data);
                return FixedArgSig{ type, is_array, data };
            }
            }
        }